

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equation-solver.cpp
# Opt level: O0

int msdfgen::solveCubicNormed(double *x,double a,double b,double c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_a0;
  double local_70;
  double t;
  double B;
  double A;
  double q3;
  double r2;
  double r;
  double q;
  double a2;
  double c_local;
  double b_local;
  double a_local;
  double *x_local;
  
  dVar1 = a * a;
  local_a0 = (b * -3.0 + dVar1) / 9.0;
  local_70 = (a * (dVar1 + dVar1 + -(b * 9.0)) + c * 27.0) / 54.0;
  dVar1 = local_a0 * local_a0 * local_a0;
  if (dVar1 <= local_70 * local_70) {
    dVar1 = sqrt(local_70 * local_70 - dVar1);
    dVar1 = pow(ABS(local_70) + dVar1,0.3333333333333333);
    B = -dVar1;
    if (local_70 < 0.0) {
      B = dVar1;
    }
    if ((B != 0.0) || (NAN(B))) {
      local_a0 = local_a0 / B;
    }
    else {
      local_a0 = 0.0;
    }
    *x = (B + local_a0) - a / 3.0;
    x[1] = (B + local_a0) * -0.5 + -(a / 3.0);
    dVar1 = sqrt(3.0);
    x[2] = dVar1 * 0.5 * (B - local_a0);
    if (1e-14 <= ABS(x[2])) {
      x_local._4_4_ = 1;
    }
    else {
      x_local._4_4_ = 2;
    }
  }
  else {
    dVar1 = sqrt(dVar1);
    local_70 = local_70 / dVar1;
    if (local_70 < -1.0) {
      local_70 = -1.0;
    }
    if (1.0 < local_70) {
      local_70 = 1.0;
    }
    dVar1 = acos(local_70);
    dVar2 = a / 3.0;
    dVar3 = sqrt(local_a0);
    dVar3 = dVar3 * -2.0;
    dVar4 = cos(dVar1 / 3.0);
    *x = dVar3 * dVar4 + -dVar2;
    dVar4 = cos((dVar1 + 6.283185307179586) / 3.0);
    x[1] = dVar3 * dVar4 + -dVar2;
    dVar1 = cos((dVar1 - 6.283185307179586) / 3.0);
    x[2] = dVar3 * dVar1 + -dVar2;
    x_local._4_4_ = 3;
  }
  return x_local._4_4_;
}

Assistant:

int solveCubicNormed(double *x, double a, double b, double c) {
    double a2 = a*a;
    double q  = (a2 - 3*b)/9; 
    double r  = (a*(2*a2-9*b) + 27*c)/54;
    double r2 = r*r;
    double q3 = q*q*q;
    double A, B;
    if (r2 < q3) {
        double t = r/sqrt(q3);
        if (t < -1) t = -1;
        if (t > 1) t = 1;
        t = acos(t);
        a /= 3; q = -2*sqrt(q);
        x[0] = q*cos(t/3)-a;
        x[1] = q*cos((t+2*M_PI)/3)-a;
        x[2] = q*cos((t-2*M_PI)/3)-a;
        return 3;
    } else {
        A = -pow(fabs(r)+sqrt(r2-q3), 1/3.); 
        if (r < 0) A = -A;
        B = A == 0 ? 0 : q/A;
        a /= 3;
        x[0] = (A+B)-a;
        x[1] = -0.5*(A+B)-a;
        x[2] = 0.5*sqrt(3.)*(A-B);
        if (fabs(x[2]) < 1e-14)
            return 2;
        return 1;
    }
}